

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O0

void snga_dot_local_patch
               (Integer atype,Integer andim,Integer *loA,Integer *hiA,Integer *ldA,void *A_ptr,
               void *B_ptr,int *alen,void *retval)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  double *pdVar7;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  long *in_R8;
  long in_R9;
  long in_stack_00000008;
  SingleComplex b_1;
  SingleComplex a_1;
  DoubleComplex b;
  DoubleComplex a;
  Integer baseldA [7];
  Integer bunit [7];
  Integer bvalue [7];
  Integer idx;
  Integer n1dim;
  Integer j;
  Integer i;
  longlong llsum;
  long lsum;
  float fsum;
  SingleComplex csum;
  DoubleComplex zsum;
  double dsum;
  int isum;
  float local_178;
  float fStack_174;
  float local_170;
  float fStack_16c;
  long local_148 [8];
  long local_108 [8];
  long local_c8 [7];
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  float local_5c;
  float local_58;
  float local_54;
  double local_50;
  double local_48;
  double local_40;
  int local_34;
  long local_30;
  long *local_28;
  long *local_20;
  long *local_18;
  long local_10;
  undefined8 local_8;
  
  local_34 = 0;
  local_40 = 0.0;
  local_50 = 0.0;
  local_48 = 0.0;
  local_5c = 0.0;
  local_68 = 0;
  local_70 = 0;
  local_58 = 0.0;
  local_54 = 0.0;
  local_88 = 1;
  for (local_78 = 1; local_78 < in_RSI; local_78 = local_78 + 1) {
    local_88 = ((in_RCX[local_78] - in_RDX[local_78]) + 1) * local_88;
  }
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_108[0] = 1;
  local_108[1] = 1;
  local_148[0] = *in_R8;
  local_148[1] = *in_R8 * in_R8[1];
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_78 = 2; local_78 < local_10; local_78 = local_78 + 1) {
    local_c8[local_78] = 0;
    local_108[local_78] =
         local_108[local_78 + -1] * ((local_20[local_78 + -1] - local_18[local_78 + -1]) + 1);
    local_148[local_78] = local_148[local_78 + -1] * local_28[local_78];
  }
  switch(local_8) {
  case 0x3e9:
    for (local_78 = 0; local_78 < local_88; local_78 = local_78 + 1) {
      local_90 = 0;
      for (local_80 = 1; local_80 < local_10; local_80 = local_80 + 1) {
        local_90 = local_c8[local_80] * local_148[local_80 + -1] + local_90;
        if ((local_78 + 1) % local_108[local_80] == 0) {
          local_c8[local_80] = local_c8[local_80] + 1;
        }
        if (local_20[local_80] - local_18[local_80] < local_c8[local_80]) {
          local_c8[local_80] = 0;
        }
      }
      for (local_80 = 0; local_80 < (*local_20 - *local_18) + 1; local_80 = local_80 + 1) {
        local_34 = *(int *)(local_30 + (local_90 + local_80) * 4) *
                   *(int *)(in_stack_00000008 + (local_90 + local_80) * 4) + local_34;
      }
    }
    *(int *)a_1 = local_34 + *(int *)a_1;
    break;
  case 0x3ea:
    for (local_78 = 0; local_78 < local_88; local_78 = local_78 + 1) {
      local_90 = 0;
      for (local_80 = 1; local_80 < local_10; local_80 = local_80 + 1) {
        local_90 = local_c8[local_80] * local_148[local_80 + -1] + local_90;
        if ((local_78 + 1) % local_108[local_80] == 0) {
          local_c8[local_80] = local_c8[local_80] + 1;
        }
        if (local_20[local_80] - local_18[local_80] < local_c8[local_80]) {
          local_c8[local_80] = 0;
        }
      }
      for (local_80 = 0; local_80 < (*local_20 - *local_18) + 1; local_80 = local_80 + 1) {
        local_68 = *(long *)(local_30 + (local_90 + local_80) * 8) *
                   *(long *)(in_stack_00000008 + (local_90 + local_80) * 8) + local_68;
      }
    }
    *(long *)a_1 = local_68 + *(long *)a_1;
    break;
  case 0x3eb:
    for (local_78 = 0; local_78 < local_88; local_78 = local_78 + 1) {
      local_90 = 0;
      for (local_80 = 1; local_80 < local_10; local_80 = local_80 + 1) {
        local_90 = local_c8[local_80] * local_148[local_80 + -1] + local_90;
        if ((local_78 + 1) % local_108[local_80] == 0) {
          local_c8[local_80] = local_c8[local_80] + 1;
        }
        if (local_20[local_80] - local_18[local_80] < local_c8[local_80]) {
          local_c8[local_80] = 0;
        }
      }
      for (local_80 = 0; local_80 < (*local_20 - *local_18) + 1; local_80 = local_80 + 1) {
        local_5c = *(float *)(local_30 + (local_90 + local_80) * 4) *
                   *(float *)(in_stack_00000008 + (local_90 + local_80) * 4) + local_5c;
      }
    }
    *(float *)a_1 = local_5c + *(float *)a_1;
    break;
  case 0x3ec:
    for (local_78 = 0; local_78 < local_88; local_78 = local_78 + 1) {
      local_90 = 0;
      for (local_80 = 1; local_80 < local_10; local_80 = local_80 + 1) {
        local_90 = local_c8[local_80] * local_148[local_80 + -1] + local_90;
        if ((local_78 + 1) % local_108[local_80] == 0) {
          local_c8[local_80] = local_c8[local_80] + 1;
        }
        if (local_20[local_80] - local_18[local_80] < local_c8[local_80]) {
          local_c8[local_80] = 0;
        }
      }
      for (local_80 = 0; local_80 < (*local_20 - *local_18) + 1; local_80 = local_80 + 1) {
        local_40 = *(double *)(local_30 + (local_90 + local_80) * 8) *
                   *(double *)(in_stack_00000008 + (local_90 + local_80) * 8) + local_40;
      }
    }
    *(double *)a_1 = local_40 + *(double *)a_1;
    break;
  default:
    pnga_error((char *)b.real,(Integer)a_1);
    break;
  case 0x3ee:
    for (local_78 = 0; local_78 < local_88; local_78 = local_78 + 1) {
      local_90 = 0;
      for (local_80 = 1; local_80 < local_10; local_80 = local_80 + 1) {
        local_90 = local_c8[local_80] * local_148[local_80 + -1] + local_90;
        if ((local_78 + 1) % local_108[local_80] == 0) {
          local_c8[local_80] = local_c8[local_80] + 1;
        }
        if (local_20[local_80] - local_18[local_80] < local_c8[local_80]) {
          local_c8[local_80] = 0;
        }
      }
      for (local_80 = 0; local_80 < (*local_20 - *local_18) + 1; local_80 = local_80 + 1) {
        uVar5 = *(undefined8 *)(local_30 + (local_90 + local_80) * 8);
        uVar6 = *(undefined8 *)(in_stack_00000008 + (local_90 + local_80) * 8);
        local_170 = (float)uVar5;
        local_178 = (float)uVar6;
        fStack_174 = (float)((ulong)uVar6 >> 0x20);
        fStack_16c = (float)((ulong)uVar5 >> 0x20);
        local_58 = local_170 * local_178 + -(fStack_174 * fStack_16c) + local_58;
        local_54 = fStack_16c * local_178 + fStack_174 * local_170 + local_54;
      }
    }
    *(float *)a_1 = local_58 + *(float *)a_1;
    *(float *)((long)a_1 + 4) = local_54 + *(float *)((long)a_1 + 4);
    break;
  case 0x3ef:
    for (local_78 = 0; local_78 < local_88; local_78 = local_78 + 1) {
      local_90 = 0;
      for (local_80 = 1; local_80 < local_10; local_80 = local_80 + 1) {
        local_90 = local_c8[local_80] * local_148[local_80 + -1] + local_90;
        if ((local_78 + 1) % local_108[local_80] == 0) {
          local_c8[local_80] = local_c8[local_80] + 1;
        }
        if (local_20[local_80] - local_18[local_80] < local_c8[local_80]) {
          local_c8[local_80] = 0;
        }
      }
      for (local_80 = 0; local_80 < (*local_20 - *local_18) + 1; local_80 = local_80 + 1) {
        pdVar7 = (double *)(local_30 + (local_90 + local_80) * 0x10);
        dVar1 = *pdVar7;
        dVar2 = pdVar7[1];
        pdVar7 = (double *)(in_stack_00000008 + (local_90 + local_80) * 0x10);
        dVar3 = *pdVar7;
        dVar4 = pdVar7[1];
        local_50 = dVar1 * dVar3 + -(dVar4 * dVar2) + local_50;
        local_48 = dVar2 * dVar3 + dVar4 * dVar1 + local_48;
      }
    }
    *(double *)a_1 = local_50 + *(double *)a_1;
    *(double *)((long)a_1 + 8) = local_48 + *(double *)((long)a_1 + 8);
    break;
  case 0x3f8:
    for (local_78 = 0; local_78 < local_88; local_78 = local_78 + 1) {
      local_90 = 0;
      for (local_80 = 1; local_80 < local_10; local_80 = local_80 + 1) {
        local_90 = local_c8[local_80] * local_148[local_80 + -1] + local_90;
        if ((local_78 + 1) % local_108[local_80] == 0) {
          local_c8[local_80] = local_c8[local_80] + 1;
        }
        if (local_20[local_80] - local_18[local_80] < local_c8[local_80]) {
          local_c8[local_80] = 0;
        }
      }
      for (local_80 = 0; local_80 < (*local_20 - *local_18) + 1; local_80 = local_80 + 1) {
        local_70 = *(long *)(local_30 + (local_90 + local_80) * 8) *
                   *(long *)(in_stack_00000008 + (local_90 + local_80) * 8) + local_70;
      }
    }
    *(long *)a_1 = local_70 + *(long *)a_1;
  }
  return;
}

Assistant:

static void snga_dot_local_patch(Integer atype, Integer andim, Integer *loA,
                          Integer *hiA, Integer *ldA, void *A_ptr, void *B_ptr,
                          int *alen, void *retval)
{
  int isum;
  double dsum;
  DoubleComplex zsum;
  SingleComplex csum;
  float fsum;
  long lsum;
  long long llsum;
  Integer i, j, n1dim, idx;
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseldA[MAXDIM];

  isum = 0; dsum = 0.; zsum.real = 0.; zsum.imag = 0.; fsum = 0;lsum=0;llsum=0;
  csum.real = 0.; csum.imag = 0.;
  
  /* number of n-element of the first dimension */
  n1dim = 1; for(i=1; i<andim; i++) n1dim *= (hiA[i] - loA[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
  /* baseldA[0] = ldA[0]
   * baseldA[1] = ldA[0] * ldA[1]
   * baseldA[2] = ldA[0] * ldA[1] * ldA[2] .....
   */
  baseldA[0] = ldA[0]; baseldA[1] = baseldA[0] *ldA[1];
  for(i=2; i<andim; i++) {
    bvalue[i] = 0;
    bunit[i] = bunit[i-1] * (hiA[i-1] - loA[i-1] + 1);
    baseldA[i] = baseldA[i-1] * ldA[i];
  }

  /* compute "local" contribution to the dot product */
  switch (atype){
    case C_INT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          isum += ((int *)A_ptr)[idx+j] *
            ((int *)B_ptr)[idx+j];
      }
      *(int*)retval += isum;
      break;
    case C_DCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++) {
          DoubleComplex a = ((DoubleComplex *)A_ptr)[idx+j];
          DoubleComplex b = ((DoubleComplex *)B_ptr)[idx+j];
          zsum.real += a.real*b.real  - b.imag * a.imag;
          zsum.imag += a.imag*b.real  + b.imag * a.real;
        }
      }
      ((double*)retval)[0] += zsum.real;
      ((double*)retval)[1] += zsum.imag;
      break;
    case C_SCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++) {
          SingleComplex a = ((SingleComplex *)A_ptr)[idx+j];
          SingleComplex b = ((SingleComplex *)B_ptr)[idx+j];
          csum.real += a.real*b.real  - b.imag * a.imag;
          csum.imag += a.imag*b.real  + b.imag * a.real;
        }
      }
      ((float*)retval)[0] += csum.real;
      ((float*)retval)[1] += csum.imag;
      break;
    case  C_DBL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          dsum += ((double*)A_ptr)[idx+j] *
            ((double*)B_ptr)[idx+j];
      }
      *(double*)retval += dsum;
      break;
    case C_FLOAT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          fsum += ((float *)A_ptr)[idx+j] *
            ((float *)B_ptr)[idx+j];
      }
      *(float*)retval += fsum;
      break;         
    case C_LONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          lsum += ((long *)A_ptr)[idx+j] *
            ((long *)B_ptr)[idx+j];
      }
      *(long*)retval += lsum;
      break;                                     
    case C_LONGLONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<andim; j++) {
          idx += bvalue[j] * baseldA[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          llsum += ((long long *)A_ptr)[idx+j] *
            ((long long *)B_ptr)[idx+j];
      }
      *(long long*)retval += llsum;
      break;
     default:
        pnga_error("snga_dot_local_patch: type not supported",atype);
        
  }
}